

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *this;
  ImGuiContext *pIVar1;
  value_type *pvVar2;
  int handler_n;
  int i;
  value_type_conflict5 local_29;
  
  pIVar1 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  this = &pIVar1->SettingsIniData;
  ImVector<char>::resize(&this->Buf,0);
  local_29 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_29);
  for (i = 0; i < (pIVar1->SettingsHandlers).Size; i = i + 1) {
    pvVar2 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar1->SettingsHandlers,i);
    (*pvVar2->WriteAllFn)(pIVar1,pvVar2,this);
  }
  if (out_size != (size_t *)0x0) {
    *out_size = (long)(this->Buf).Size - 1;
  }
  return (pIVar1->SettingsIniData).Buf.Data;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}